

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall TestDateTime::testDateTime(TestDateTime *this)

{
  int iVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  DateTimePicker *pDVar5;
  ulong uVar6;
  const_reference piVar7;
  QPointingDevice *pQVar8;
  undefined4 in_stack_fffffffffffff76c;
  QTime local_644;
  QDate local_640;
  QDateTime local_638 [8];
  undefined1 local_630 [20];
  KeyboardModifiers local_61c;
  QString local_618;
  QFlags<Qt::KeyboardModifier> local_600;
  QFlags<Qt::MouseButton> local_5fc;
  QPoint local_5f8;
  QPoint local_5f0;
  QPointF local_5e8;
  QPoint local_5d8;
  QPointF local_5d0;
  QMouseEvent local_5c0 [8];
  QMouseEvent me_5;
  KeyboardModifiers local_568;
  QPoint local_564;
  QPoint p_5;
  QDateTime local_550 [8];
  undefined1 local_548 [20];
  KeyboardModifiers local_534;
  QString local_530;
  QFlags<Qt::KeyboardModifier> local_518;
  QFlags<Qt::MouseButton> local_514;
  QPoint local_510;
  QPoint local_508;
  QPointF local_500;
  QPoint local_4f0;
  QPointF local_4e8;
  QMouseEvent local_4d8 [8];
  QMouseEvent me_4;
  KeyboardModifiers local_480;
  QPoint local_47c;
  QPoint p_4;
  QDateTime local_468 [8];
  undefined1 local_460 [20];
  KeyboardModifiers local_44c;
  QString local_448;
  QFlags<Qt::KeyboardModifier> local_430;
  QFlags<Qt::MouseButton> local_42c;
  QPoint local_428;
  QPoint local_420;
  QPointF local_418;
  QPoint local_408;
  QPointF local_400;
  QMouseEvent local_3f0 [8];
  QMouseEvent me_3;
  KeyboardModifiers local_398;
  QPoint local_394;
  QPoint p_3;
  QDateTime local_380 [8];
  undefined1 local_378 [20];
  KeyboardModifiers local_364;
  QString local_360;
  QFlags<Qt::KeyboardModifier> local_348;
  QFlags<Qt::MouseButton> local_344;
  QPoint local_340;
  QPoint local_338;
  QPointF local_330;
  QPoint local_320;
  QPointF local_318;
  QMouseEvent local_308 [8];
  QMouseEvent me_2;
  KeyboardModifiers local_2b0;
  QPoint local_2ac;
  QPoint p_2;
  QDateTime local_298 [8];
  undefined1 local_290 [20];
  KeyboardModifiers local_27c;
  QString local_278;
  QFlags<Qt::KeyboardModifier> local_260;
  QFlags<Qt::MouseButton> local_25c;
  QPoint local_258;
  QPoint local_250;
  QPointF local_248;
  QPoint local_238;
  QPointF local_230;
  QMouseEvent local_220 [8];
  QMouseEvent me_1;
  KeyboardModifiers local_1c8;
  QPoint local_1c4;
  QPoint p_1;
  QDateTime local_1b0 [8];
  undefined1 local_1a8 [20];
  KeyboardModifiers local_194;
  QString local_190;
  QFlags<Qt::KeyboardModifier> local_178;
  QFlags<Qt::MouseButton> local_174;
  QPoint local_170;
  QPoint local_168;
  QPointF local_160;
  QPoint local_150;
  QPointF local_148;
  QMouseEvent local_138 [8];
  QMouseEvent me;
  KeyboardModifiers local_dc;
  QPoint local_d8;
  QPoint p;
  QTime local_c4;
  QDate local_c0;
  QDateTime local_b8 [8];
  undefined1 local_b0 [12];
  QTime local_a4;
  QDate local_a0;
  QDateTime local_98 [8];
  undefined1 local_90 [8];
  QTime local_88;
  QTime local_84;
  QTime local_80;
  QTime local_7c;
  QDate local_78;
  QDate local_70;
  uint local_64;
  QDate local_60;
  QDate local_58;
  QTime local_4c;
  QDate local_48;
  QDateTime local_40 [8];
  QDateTime dt;
  QDate local_28;
  QDateTime local_20 [8];
  undefined1 local_18 [16];
  TestDateTime *this_local;
  
  local_18._8_8_ = this;
  QSharedPointer<QtMWidgets::DateTimePicker>::operator->(&this->m_dt);
  QWidget::show();
  pDVar5 = QSharedPointer<QtMWidgets::DateTimePicker>::data(&this->m_dt);
  bVar2 = QTest::qWaitForWindowActive(&pDVar5->super_QWidget,5000);
  uVar6 = QTest::qVerify((bool)(bVar2 & 1),"QTest::qWaitForWindowActive( m_dt.data() )","",
                         "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/datetime/main.cpp"
                         ,0x98);
  if ((uVar6 & 1) != 0) {
    QSharedPointer<QtMWidgets::DateTimePicker>::operator->(&this->m_dt);
    QtMWidgets::DateTimePicker::dateTime((DateTimePicker *)local_18);
    QDate::QDate(&local_28,2000,1,1);
    QTime::QTime((QTime *)&dt,0,0,0,0);
    QDateTime::QDateTime(local_20,(QDate *)local_28.jd,(QTime *)(ulong)_dt,LocalTime,0);
    bVar3 = ::operator==((QDateTime *)local_18,local_20);
    bVar2 = QTest::qVerify(bVar3,
                           "m_dt->dateTime() == QDateTime( DATETIMEPICKER_DATE_INITIAL, DATETIMEPICKER_TIME_MIN )"
                           ,"",
                           "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/datetime/main.cpp"
                           ,0x9b);
    QDateTime::~QDateTime(local_20);
    QDateTime::~QDateTime((QDateTime *)local_18);
    if (((bVar2 ^ 0xff) & 1) == 0) {
      QDate::QDate(&local_48,0x7e4,10,0x18);
      QTime::QTime(&local_4c,0xd,0xc,0,0);
      QDateTime::QDateTime
                (local_40,(QDate *)local_48.jd,(QTime *)(ulong)(uint)local_4c.mds,LocalTime,0);
      pDVar5 = QSharedPointer<QtMWidgets::DateTimePicker>::operator->(&this->m_dt);
      QtMWidgets::DateTimePicker::setDateTime(pDVar5,local_40);
      pDVar5 = QSharedPointer<QtMWidgets::DateTimePicker>::operator->(&this->m_dt);
      local_58 = QtMWidgets::DateTimePicker::minimumDate(pDVar5);
      QDate::QDate(&local_60,0x6d8,9,0xe);
      bVar3 = ::operator==(local_58,local_60);
      bVar2 = QTest::qVerify(bVar3,"m_dt->minimumDate() == DATETIMEPICKER_COMPAT_DATE_MIN","",
                             "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/datetime/main.cpp"
                             ,0xa0);
      if ((bVar2 & 1) == 0) {
        local_64 = 1;
      }
      else {
        pDVar5 = QSharedPointer<QtMWidgets::DateTimePicker>::operator->(&this->m_dt);
        local_70 = QtMWidgets::DateTimePicker::maximumDate(pDVar5);
        QDate::QDate(&local_78,7999,0xc,0x1f);
        bVar3 = ::operator==(local_70,local_78);
        bVar2 = QTest::qVerify(bVar3,"m_dt->maximumDate() == DATETIMEPICKER_DATE_MAX","",
                               "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/datetime/main.cpp"
                               ,0xa1);
        if ((bVar2 & 1) == 0) {
          local_64 = 1;
        }
        else {
          pDVar5 = QSharedPointer<QtMWidgets::DateTimePicker>::operator->(&this->m_dt);
          local_7c = QtMWidgets::DateTimePicker::minimumTime(pDVar5);
          QTime::QTime(&local_80,0,0,0,0);
          bVar3 = ::operator==(local_7c,local_80);
          bVar2 = QTest::qVerify(bVar3,"m_dt->minimumTime() == DATETIMEPICKER_TIME_MIN","",
                                 "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/datetime/main.cpp"
                                 ,0xa2);
          if ((bVar2 & 1) == 0) {
            local_64 = 1;
          }
          else {
            pDVar5 = QSharedPointer<QtMWidgets::DateTimePicker>::operator->(&this->m_dt);
            local_84 = QtMWidgets::DateTimePicker::maximumTime(pDVar5);
            QTime::QTime(&local_88,0x17,0x3b,0x3b,999);
            bVar3 = ::operator==(local_84,local_88);
            bVar2 = QTest::qVerify(bVar3,"m_dt->maximumTime() == DATETIMEPICKER_TIME_MAX","",
                                   "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/datetime/main.cpp"
                                   ,0xa3);
            if ((bVar2 & 1) == 0) {
              local_64 = 1;
            }
            else {
              QSharedPointer<QtMWidgets::DateTimePicker>::operator->(&this->m_dt);
              QtMWidgets::DateTimePicker::minimumDateTime((DateTimePicker *)local_90);
              QDate::QDate(&local_a0,0x6d8,9,0xe);
              QTime::QTime(&local_a4,0,0,0,0);
              QDateTime::QDateTime
                        (local_98,(QDate *)local_a0.jd,(QTime *)(ulong)(uint)local_a4.mds,LocalTime,
                         0);
              bVar3 = ::operator==((QDateTime *)local_90,local_98);
              bVar2 = QTest::qVerify(bVar3,
                                     "m_dt->minimumDateTime() == DATETIMEPICKER_COMPAT_DATETIME_MIN"
                                     ,"",
                                     "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/datetime/main.cpp"
                                     ,0xa4);
              QDateTime::~QDateTime(local_98);
              QDateTime::~QDateTime((QDateTime *)local_90);
              if (((bVar2 ^ 0xff) & 1) == 0) {
                QSharedPointer<QtMWidgets::DateTimePicker>::operator->(&this->m_dt);
                QtMWidgets::DateTimePicker::maximumDateTime((DateTimePicker *)local_b0);
                QDate::QDate(&local_c0,7999,0xc,0x1f);
                QTime::QTime(&local_c4,0x17,0x3b,0x3b,999);
                QDateTime::QDateTime
                          (local_b8,(QDate *)local_c0.jd,(QTime *)(ulong)(uint)local_c4.mds,
                           LocalTime,0);
                bVar3 = ::operator==((QDateTime *)local_b0,local_b8);
                bVar2 = QTest::qVerify(bVar3,
                                       "m_dt->maximumDateTime() == DATETIMEPICKER_DATETIME_MAX","",
                                       "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/datetime/main.cpp"
                                       ,0xa5);
                QDateTime::~QDateTime(local_b8);
                QDateTime::~QDateTime((QDateTime *)local_b0);
                if (((bVar2 ^ 0xff) & 1) == 0) {
                  QSharedPointer<QtMWidgets::DateTimePicker>::operator->(&this->m_dt);
                  QtMWidgets::DateTimePicker::dateTime((DateTimePicker *)&p);
                  bVar3 = ::operator==((QDateTime *)&p,local_40);
                  bVar2 = QTest::qVerify(bVar3,"m_dt->dateTime() == dt","",
                                         "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/datetime/main.cpp"
                                         ,0xa7);
                  QDateTime::~QDateTime((QDateTime *)&p);
                  if (((bVar2 ^ 0xff) & 1) == 0) {
                    QSharedPointer<QtMWidgets::DateTimePicker>::operator->(&this->m_dt);
                    QWidget::update();
                    QTest::qWait(500);
                    piVar7 = QList<int>::at(&this->m_dtSections,0);
                    iVar1 = *piVar7;
                    pDVar5 = QSharedPointer<QtMWidgets::DateTimePicker>::operator->(&this->m_dt);
                    iVar4 = QWidget::height(&pDVar5->super_QWidget);
                    QPoint::QPoint(&local_d8,iVar1,iVar4 / 2);
                    pDVar5 = QSharedPointer<QtMWidgets::DateTimePicker>::data(&this->m_dt);
                    QFlags<Qt::KeyboardModifier>::QFlags(&local_dc);
                    QTest::mousePress(&pDVar5->super_QWidget,LeftButton,local_dc,local_d8,0x14);
                    local_150 = operator+(&local_d8,&this->m_delta);
                    QPointF::QPointF(&local_148,&local_150);
                    pDVar5 = QSharedPointer<QtMWidgets::DateTimePicker>::operator->(&this->m_dt);
                    local_170 = operator+(&local_d8,&this->m_delta);
                    local_168 = (QPoint)QWidget::mapToGlobal((QPoint *)pDVar5);
                    QPointF::QPointF(&local_160,&local_168);
                    QFlags<Qt::MouseButton>::QFlags(&local_174,LeftButton);
                    QFlags<Qt::KeyboardModifier>::QFlags(&local_178);
                    QString::QString(&local_190);
                    pQVar8 = (QPointingDevice *)
                             QPointingDevice::primaryPointingDevice((QString *)&local_190);
                    QMouseEvent::QMouseEvent
                              (local_138,MouseMove,&local_148,&local_160,LeftButton,
                               (QFlags_conflict1 *)(ulong)local_174.i,
                               (QFlags_conflict1 *)CONCAT44(in_stack_fffffffffffff76c,local_178.i),
                               pQVar8);
                    QString::~QString(&local_190);
                    pDVar5 = QSharedPointer<QtMWidgets::DateTimePicker>::data(&this->m_dt);
                    QCoreApplication::sendEvent((QObject *)pDVar5,(QEvent *)local_138);
                    QTest::qWait(500);
                    pDVar5 = QSharedPointer<QtMWidgets::DateTimePicker>::data(&this->m_dt);
                    QFlags<Qt::KeyboardModifier>::QFlags(&local_194);
                    local_1a8._12_8_ = operator+(&local_d8,&this->m_delta);
                    QTest::mouseRelease(&pDVar5->super_QWidget,LeftButton,local_194,
                                        (QPoint)local_1a8._12_8_,0x14);
                    QTest::qWait(500);
                    QSharedPointer<QtMWidgets::DateTimePicker>::operator->(&this->m_dt);
                    QtMWidgets::DateTimePicker::dateTime((DateTimePicker *)local_1a8);
                    QDate::QDate((QDate *)&p_1.yp,0x7e4,10,0x19);
                    QTime::QTime((QTime *)&p_1,0xd,0xc,0,0);
                    QDateTime::QDateTime
                              (local_1b0,stack0xfffffffffffffe48,(QTime *)(ulong)(uint)p_1.xp,
                               LocalTime,0);
                    bVar3 = ::operator==((QDateTime *)local_1a8,local_1b0);
                    bVar2 = QTest::qVerify(bVar3,
                                           "m_dt->dateTime() == QDateTime( { 2020, 10, 25 }, { 13, 12 } )"
                                           ,"",
                                           "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/datetime/main.cpp"
                                           ,0xb8);
                    QDateTime::~QDateTime(local_1b0);
                    QDateTime::~QDateTime((QDateTime *)local_1a8);
                    local_64 = (uint)(((bVar2 ^ 0xff) & 1) != 0);
                    QMouseEvent::~QMouseEvent(local_138);
                    if (local_64 == 0) {
                      piVar7 = QList<int>::at(&this->m_dtSections,1);
                      iVar1 = *piVar7;
                      pDVar5 = QSharedPointer<QtMWidgets::DateTimePicker>::operator->(&this->m_dt);
                      iVar4 = QWidget::height(&pDVar5->super_QWidget);
                      QPoint::QPoint(&local_1c4,iVar1,iVar4 / 2);
                      pDVar5 = QSharedPointer<QtMWidgets::DateTimePicker>::data(&this->m_dt);
                      QFlags<Qt::KeyboardModifier>::QFlags(&local_1c8);
                      QTest::mousePress(&pDVar5->super_QWidget,LeftButton,local_1c8,local_1c4,0x14);
                      local_238 = operator+(&local_1c4,&this->m_delta);
                      QPointF::QPointF(&local_230,&local_238);
                      pDVar5 = QSharedPointer<QtMWidgets::DateTimePicker>::operator->(&this->m_dt);
                      local_258 = operator+(&local_1c4,&this->m_delta);
                      local_250 = (QPoint)QWidget::mapToGlobal((QPoint *)pDVar5);
                      QPointF::QPointF(&local_248,&local_250);
                      QFlags<Qt::MouseButton>::QFlags(&local_25c,LeftButton);
                      QFlags<Qt::KeyboardModifier>::QFlags(&local_260);
                      QString::QString(&local_278);
                      pQVar8 = (QPointingDevice *)
                               QPointingDevice::primaryPointingDevice((QString *)&local_278);
                      QMouseEvent::QMouseEvent
                                (local_220,MouseMove,&local_230,&local_248,LeftButton,
                                 (QFlags_conflict1 *)(ulong)local_25c.i,
                                 (QFlags_conflict1 *)CONCAT44(in_stack_fffffffffffff76c,local_260.i)
                                 ,pQVar8);
                      QString::~QString(&local_278);
                      pDVar5 = QSharedPointer<QtMWidgets::DateTimePicker>::data(&this->m_dt);
                      QCoreApplication::sendEvent((QObject *)pDVar5,(QEvent *)local_220);
                      QTest::qWait(500);
                      pDVar5 = QSharedPointer<QtMWidgets::DateTimePicker>::data(&this->m_dt);
                      QFlags<Qt::KeyboardModifier>::QFlags(&local_27c);
                      local_290._12_8_ = operator+(&local_1c4,&this->m_delta);
                      QTest::mouseRelease(&pDVar5->super_QWidget,LeftButton,local_27c,
                                          (QPoint)local_290._12_8_,0x14);
                      QTest::qWait(500);
                      QSharedPointer<QtMWidgets::DateTimePicker>::operator->(&this->m_dt);
                      QtMWidgets::DateTimePicker::dateTime((DateTimePicker *)local_290);
                      QDate::QDate((QDate *)&p_2.yp,0x7e4,0xb,0x19);
                      QTime::QTime((QTime *)&p_2,0xd,0xc,0,0);
                      QDateTime::QDateTime
                                (local_298,stack0xfffffffffffffd60,(QTime *)(ulong)(uint)p_2.xp,
                                 LocalTime,0);
                      bVar3 = ::operator==((QDateTime *)local_290,local_298);
                      bVar2 = QTest::qVerify(bVar3,
                                             "m_dt->dateTime() == QDateTime( { 2020, 11, 25 }, { 13, 12 } )"
                                             ,"",
                                             "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/datetime/main.cpp"
                                             ,0xc6);
                      QDateTime::~QDateTime(local_298);
                      QDateTime::~QDateTime((QDateTime *)local_290);
                      local_64 = (uint)(((bVar2 ^ 0xff) & 1) != 0);
                      QMouseEvent::~QMouseEvent(local_220);
                      if (local_64 == 0) {
                        piVar7 = QList<int>::at(&this->m_dtSections,2);
                        iVar1 = *piVar7;
                        pDVar5 = QSharedPointer<QtMWidgets::DateTimePicker>::operator->(&this->m_dt)
                        ;
                        iVar4 = QWidget::height(&pDVar5->super_QWidget);
                        QPoint::QPoint(&local_2ac,iVar1,iVar4 / 2);
                        pDVar5 = QSharedPointer<QtMWidgets::DateTimePicker>::data(&this->m_dt);
                        QFlags<Qt::KeyboardModifier>::QFlags(&local_2b0);
                        QTest::mousePress(&pDVar5->super_QWidget,LeftButton,local_2b0,local_2ac,0x14
                                         );
                        local_320 = operator+(&local_2ac,&this->m_delta);
                        QPointF::QPointF(&local_318,&local_320);
                        pDVar5 = QSharedPointer<QtMWidgets::DateTimePicker>::operator->(&this->m_dt)
                        ;
                        local_340 = operator+(&local_2ac,&this->m_delta);
                        local_338 = (QPoint)QWidget::mapToGlobal((QPoint *)pDVar5);
                        QPointF::QPointF(&local_330,&local_338);
                        QFlags<Qt::MouseButton>::QFlags(&local_344,LeftButton);
                        QFlags<Qt::KeyboardModifier>::QFlags(&local_348);
                        QString::QString(&local_360);
                        pQVar8 = (QPointingDevice *)
                                 QPointingDevice::primaryPointingDevice((QString *)&local_360);
                        QMouseEvent::QMouseEvent
                                  (local_308,MouseMove,&local_318,&local_330,LeftButton,
                                   (QFlags_conflict1 *)(ulong)local_344.i,
                                   (QFlags_conflict1 *)
                                   CONCAT44(in_stack_fffffffffffff76c,local_348.i),pQVar8);
                        QString::~QString(&local_360);
                        pDVar5 = QSharedPointer<QtMWidgets::DateTimePicker>::data(&this->m_dt);
                        QCoreApplication::sendEvent((QObject *)pDVar5,(QEvent *)local_308);
                        QTest::qWait(500);
                        pDVar5 = QSharedPointer<QtMWidgets::DateTimePicker>::data(&this->m_dt);
                        QFlags<Qt::KeyboardModifier>::QFlags(&local_364);
                        local_378._12_8_ = operator+(&local_2ac,&this->m_delta);
                        QTest::mouseRelease(&pDVar5->super_QWidget,LeftButton,local_364,
                                            (QPoint)local_378._12_8_,0x14);
                        QTest::qWait(500);
                        QSharedPointer<QtMWidgets::DateTimePicker>::operator->(&this->m_dt);
                        QtMWidgets::DateTimePicker::dateTime((DateTimePicker *)local_378);
                        QDate::QDate((QDate *)&p_3.yp,0x7e5,0xb,0x19);
                        QTime::QTime((QTime *)&p_3,0xd,0xc,0,0);
                        QDateTime::QDateTime
                                  (local_380,stack0xfffffffffffffc78,(QTime *)(ulong)(uint)p_3.xp,
                                   LocalTime,0);
                        bVar3 = ::operator==((QDateTime *)local_378,local_380);
                        bVar2 = QTest::qVerify(bVar3,
                                               "m_dt->dateTime() == QDateTime( { 2021, 11, 25 }, { 13, 12 } )"
                                               ,"",
                                               "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/datetime/main.cpp"
                                               ,0xd5);
                        QDateTime::~QDateTime(local_380);
                        QDateTime::~QDateTime((QDateTime *)local_378);
                        local_64 = (uint)(((bVar2 ^ 0xff) & 1) != 0);
                        QMouseEvent::~QMouseEvent(local_308);
                        if (local_64 == 0) {
                          piVar7 = QList<int>::at(&this->m_dtSections,3);
                          iVar1 = *piVar7;
                          pDVar5 = QSharedPointer<QtMWidgets::DateTimePicker>::operator->
                                             (&this->m_dt);
                          iVar4 = QWidget::height(&pDVar5->super_QWidget);
                          QPoint::QPoint(&local_394,iVar1,iVar4 / 2);
                          pDVar5 = QSharedPointer<QtMWidgets::DateTimePicker>::data(&this->m_dt);
                          QFlags<Qt::KeyboardModifier>::QFlags(&local_398);
                          QTest::mousePress(&pDVar5->super_QWidget,LeftButton,local_398,local_394,
                                            0x14);
                          local_408 = operator+(&local_394,&this->m_delta);
                          QPointF::QPointF(&local_400,&local_408);
                          pDVar5 = QSharedPointer<QtMWidgets::DateTimePicker>::operator->
                                             (&this->m_dt);
                          local_428 = operator+(&local_394,&this->m_delta);
                          local_420 = (QPoint)QWidget::mapToGlobal((QPoint *)pDVar5);
                          QPointF::QPointF(&local_418,&local_420);
                          QFlags<Qt::MouseButton>::QFlags(&local_42c,LeftButton);
                          QFlags<Qt::KeyboardModifier>::QFlags(&local_430);
                          QString::QString(&local_448);
                          pQVar8 = (QPointingDevice *)
                                   QPointingDevice::primaryPointingDevice((QString *)&local_448);
                          QMouseEvent::QMouseEvent
                                    (local_3f0,MouseMove,&local_400,&local_418,LeftButton,
                                     (QFlags_conflict1 *)(ulong)local_42c.i,
                                     (QFlags_conflict1 *)
                                     CONCAT44(in_stack_fffffffffffff76c,local_430.i),pQVar8);
                          QString::~QString(&local_448);
                          pDVar5 = QSharedPointer<QtMWidgets::DateTimePicker>::data(&this->m_dt);
                          QCoreApplication::sendEvent((QObject *)pDVar5,(QEvent *)local_3f0);
                          QTest::qWait(500);
                          pDVar5 = QSharedPointer<QtMWidgets::DateTimePicker>::data(&this->m_dt);
                          QFlags<Qt::KeyboardModifier>::QFlags(&local_44c);
                          local_460._12_8_ = operator+(&local_394,&this->m_delta);
                          QTest::mouseRelease(&pDVar5->super_QWidget,LeftButton,local_44c,
                                              (QPoint)local_460._12_8_,0x14);
                          QTest::qWait(500);
                          QSharedPointer<QtMWidgets::DateTimePicker>::operator->(&this->m_dt);
                          QtMWidgets::DateTimePicker::dateTime((DateTimePicker *)local_460);
                          QDate::QDate((QDate *)&p_4.yp,0x7e5,0xb,0x19);
                          QTime::QTime((QTime *)&p_4,0xe,0xc,0,0);
                          QDateTime::QDateTime
                                    (local_468,stack0xfffffffffffffb90,(QTime *)(ulong)(uint)p_4.xp,
                                     LocalTime,0);
                          bVar3 = ::operator==((QDateTime *)local_460,local_468);
                          bVar2 = QTest::qVerify(bVar3,
                                                 "m_dt->dateTime() == QDateTime( { 2021, 11, 25 }, { 14, 12 } )"
                                                 ,"",
                                                 "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/datetime/main.cpp"
                                                 ,0xe4);
                          QDateTime::~QDateTime(local_468);
                          QDateTime::~QDateTime((QDateTime *)local_460);
                          local_64 = (uint)(((bVar2 ^ 0xff) & 1) != 0);
                          QMouseEvent::~QMouseEvent(local_3f0);
                          if (local_64 == 0) {
                            piVar7 = QList<int>::at(&this->m_dtSections,4);
                            iVar1 = *piVar7;
                            pDVar5 = QSharedPointer<QtMWidgets::DateTimePicker>::operator->
                                               (&this->m_dt);
                            iVar4 = QWidget::height(&pDVar5->super_QWidget);
                            QPoint::QPoint(&local_47c,iVar1,iVar4 / 2);
                            pDVar5 = QSharedPointer<QtMWidgets::DateTimePicker>::data(&this->m_dt);
                            QFlags<Qt::KeyboardModifier>::QFlags(&local_480);
                            QTest::mousePress(&pDVar5->super_QWidget,LeftButton,local_480,local_47c,
                                              0x14);
                            local_4f0 = operator+(&local_47c,&this->m_delta);
                            QPointF::QPointF(&local_4e8,&local_4f0);
                            pDVar5 = QSharedPointer<QtMWidgets::DateTimePicker>::operator->
                                               (&this->m_dt);
                            local_510 = operator+(&local_47c,&this->m_delta);
                            local_508 = (QPoint)QWidget::mapToGlobal((QPoint *)pDVar5);
                            QPointF::QPointF(&local_500,&local_508);
                            QFlags<Qt::MouseButton>::QFlags(&local_514,LeftButton);
                            QFlags<Qt::KeyboardModifier>::QFlags(&local_518);
                            QString::QString(&local_530);
                            pQVar8 = (QPointingDevice *)
                                     QPointingDevice::primaryPointingDevice((QString *)&local_530);
                            QMouseEvent::QMouseEvent
                                      (local_4d8,MouseMove,&local_4e8,&local_500,LeftButton,
                                       (QFlags_conflict1 *)(ulong)local_514.i,
                                       (QFlags_conflict1 *)
                                       CONCAT44(in_stack_fffffffffffff76c,local_518.i),pQVar8);
                            QString::~QString(&local_530);
                            pDVar5 = QSharedPointer<QtMWidgets::DateTimePicker>::data(&this->m_dt);
                            QCoreApplication::sendEvent((QObject *)pDVar5,(QEvent *)local_4d8);
                            QTest::qWait(500);
                            pDVar5 = QSharedPointer<QtMWidgets::DateTimePicker>::data(&this->m_dt);
                            QFlags<Qt::KeyboardModifier>::QFlags(&local_534);
                            local_548._12_8_ = operator+(&local_47c,&this->m_delta);
                            QTest::mouseRelease(&pDVar5->super_QWidget,LeftButton,local_534,
                                                (QPoint)local_548._12_8_,0x14);
                            QTest::qWait(500);
                            QSharedPointer<QtMWidgets::DateTimePicker>::operator->(&this->m_dt);
                            QtMWidgets::DateTimePicker::dateTime((DateTimePicker *)local_548);
                            QDate::QDate((QDate *)&p_5.yp,0x7e5,0xb,0x19);
                            QTime::QTime((QTime *)&p_5,0xe,0xd,0,0);
                            QDateTime::QDateTime
                                      (local_550,stack0xfffffffffffffaa8,
                                       (QTime *)(ulong)(uint)p_5.xp,LocalTime,0);
                            bVar3 = ::operator==((QDateTime *)local_548,local_550);
                            bVar2 = QTest::qVerify(bVar3,
                                                  "m_dt->dateTime() == QDateTime( { 2021, 11, 25 }, { 14, 13 } )"
                                                  ,"",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/datetime/main.cpp"
                                                  ,0xf3);
                            QDateTime::~QDateTime(local_550);
                            QDateTime::~QDateTime((QDateTime *)local_548);
                            local_64 = (uint)(((bVar2 ^ 0xff) & 1) != 0);
                            QMouseEvent::~QMouseEvent(local_4d8);
                            if (local_64 == 0) {
                              piVar7 = QList<int>::at(&this->m_dtSections,5);
                              iVar1 = *piVar7;
                              pDVar5 = QSharedPointer<QtMWidgets::DateTimePicker>::operator->
                                                 (&this->m_dt);
                              iVar4 = QWidget::height(&pDVar5->super_QWidget);
                              QPoint::QPoint(&local_564,iVar1,iVar4 / 2);
                              pDVar5 = QSharedPointer<QtMWidgets::DateTimePicker>::data(&this->m_dt)
                              ;
                              QFlags<Qt::KeyboardModifier>::QFlags(&local_568);
                              QTest::mousePress(&pDVar5->super_QWidget,LeftButton,local_568,
                                                local_564,0x14);
                              local_5d8 = operator-(&local_564,&this->m_delta);
                              QPointF::QPointF(&local_5d0,&local_5d8);
                              pDVar5 = QSharedPointer<QtMWidgets::DateTimePicker>::operator->
                                                 (&this->m_dt);
                              local_5f8 = operator-(&local_564,&this->m_delta);
                              local_5f0 = (QPoint)QWidget::mapToGlobal((QPoint *)pDVar5);
                              QPointF::QPointF(&local_5e8,&local_5f0);
                              QFlags<Qt::MouseButton>::QFlags(&local_5fc,LeftButton);
                              QFlags<Qt::KeyboardModifier>::QFlags(&local_600);
                              QString::QString(&local_618);
                              pQVar8 = (QPointingDevice *)
                                       QPointingDevice::primaryPointingDevice((QString *)&local_618)
                              ;
                              QMouseEvent::QMouseEvent
                                        (local_5c0,MouseMove,&local_5d0,&local_5e8,LeftButton,
                                         (QFlags_conflict1 *)(ulong)local_5fc.i,
                                         (QFlags_conflict1 *)
                                         CONCAT44(in_stack_fffffffffffff76c,local_600.i),pQVar8);
                              QString::~QString(&local_618);
                              pDVar5 = QSharedPointer<QtMWidgets::DateTimePicker>::data(&this->m_dt)
                              ;
                              QCoreApplication::sendEvent((QObject *)pDVar5,(QEvent *)local_5c0);
                              QTest::qWait(500);
                              pDVar5 = QSharedPointer<QtMWidgets::DateTimePicker>::data(&this->m_dt)
                              ;
                              QFlags<Qt::KeyboardModifier>::QFlags(&local_61c);
                              local_630._12_8_ = operator-(&local_564,&this->m_delta);
                              QTest::mouseRelease(&pDVar5->super_QWidget,LeftButton,local_61c,
                                                  (QPoint)local_630._12_8_,0x14);
                              QTest::qWait(500);
                              QSharedPointer<QtMWidgets::DateTimePicker>::operator->(&this->m_dt);
                              QtMWidgets::DateTimePicker::dateTime((DateTimePicker *)local_630);
                              QDate::QDate(&local_640,0x7e5,0xb,0x19);
                              QTime::QTime(&local_644,2,0xd,0,0);
                              QDateTime::QDateTime
                                        (local_638,(QDate *)local_640.jd,
                                         (QTime *)(ulong)(uint)local_644.mds,LocalTime,0);
                              bVar3 = ::operator==((QDateTime *)local_630,local_638);
                              bVar2 = QTest::qVerify(bVar3,
                                                  "m_dt->dateTime() == QDateTime( { 2021, 11, 25 }, { 2, 13 } )"
                                                  ,"",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/datetime/main.cpp"
                                                  ,0x102);
                              QDateTime::~QDateTime(local_638);
                              QDateTime::~QDateTime((QDateTime *)local_630);
                              local_64 = (uint)(((bVar2 ^ 0xff) & 1) != 0);
                              QMouseEvent::~QMouseEvent(local_5c0);
                              if (local_64 == 0) {
                                QSharedPointer<QtMWidgets::DateTimePicker>::operator->(&this->m_dt);
                                QWidget::hide();
                                local_64 = 0;
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                  else {
                    local_64 = 1;
                  }
                }
                else {
                  local_64 = 1;
                }
              }
              else {
                local_64 = 1;
              }
            }
          }
        }
      }
      QDateTime::~QDateTime(local_40);
    }
  }
  return;
}

Assistant:

void testDateTime()
	{
		m_dt->show();

		QVERIFY( QTest::qWaitForWindowActive( m_dt.data() ) );

		QVERIFY( m_dt->dateTime() == QDateTime( DATETIMEPICKER_DATE_INITIAL,
			DATETIMEPICKER_TIME_MIN ) );

		const QDateTime dt = { { 2020, 10, 24 }, { 13, 12 } };
		m_dt->setDateTime( dt );

		QVERIFY( m_dt->minimumDate() == DATETIMEPICKER_COMPAT_DATE_MIN );
		QVERIFY( m_dt->maximumDate() == DATETIMEPICKER_DATE_MAX );
		QVERIFY( m_dt->minimumTime() == DATETIMEPICKER_TIME_MIN );
		QVERIFY( m_dt->maximumTime() == DATETIMEPICKER_TIME_MAX );
		QVERIFY( m_dt->minimumDateTime() == DATETIMEPICKER_COMPAT_DATETIME_MIN );
		QVERIFY( m_dt->maximumDateTime() == DATETIMEPICKER_DATETIME_MAX );

		QVERIFY( m_dt->dateTime() == dt );

		m_dt->update();

		QTest::qWait( 500 );

		{
			QPoint p( m_dtSections.at( 0 ), m_dt->height() / 2 );
			QTest::mousePress( m_dt.data(), Qt::LeftButton, {}, p, 20 );
			QMouseEvent me( QEvent::MouseMove, p + m_delta,
				m_dt->mapToGlobal( p + m_delta ),
				Qt::LeftButton, Qt::LeftButton, {} );
			QApplication::sendEvent( m_dt.data(), &me );
			QTest::qWait( 500 );
			QTest::mouseRelease( m_dt.data(), Qt::LeftButton, {}, p + m_delta, 20 );
			QTest::qWait( 500 );

			QVERIFY( m_dt->dateTime() == QDateTime( { 2020, 10, 25 }, { 13, 12 } ) );
		}

		{
			QPoint p( m_dtSections.at( 1 ), m_dt->height() / 2 );
			QTest::mousePress( m_dt.data(), Qt::LeftButton, {}, p, 20 );
			QMouseEvent me( QEvent::MouseMove, p + m_delta,
				m_dt->mapToGlobal( p + m_delta ),
				Qt::LeftButton, Qt::LeftButton, {} );
			QApplication::sendEvent( m_dt.data(), &me );
			QTest::qWait( 500 );
			QTest::mouseRelease( m_dt.data(), Qt::LeftButton, {}, p + m_delta, 20 );
			QTest::qWait( 500 );

			QVERIFY( m_dt->dateTime() == QDateTime( { 2020, 11, 25 }, { 13, 12 } ) );
		}

		{
			QPoint p( m_dtSections.at( 2 ), m_dt->height() / 2 );
			QTest::mousePress( m_dt.data(), Qt::LeftButton, {}, p, 20 );
			QMouseEvent me( QEvent::MouseMove, p + m_delta,
				m_dt->mapToGlobal( p + m_delta ),
				Qt::LeftButton, Qt::LeftButton, {} );
			QApplication::sendEvent( m_dt.data(), &me );
			QTest::qWait( 500 );
			QTest::mouseRelease( m_dt.data(), Qt::LeftButton, {}, p + m_delta, 20 );

			QTest::qWait( 500 );

			QVERIFY( m_dt->dateTime() == QDateTime( { 2021, 11, 25 }, { 13, 12 } ) );
		}

		{
			QPoint p( m_dtSections.at( 3 ), m_dt->height() / 2 );
			QTest::mousePress( m_dt.data(), Qt::LeftButton, {}, p, 20 );
			QMouseEvent me( QEvent::MouseMove, p + m_delta,
				m_dt->mapToGlobal( p + m_delta ),
				Qt::LeftButton, Qt::LeftButton, {} );
			QApplication::sendEvent( m_dt.data(), &me );
			QTest::qWait( 500 );
			QTest::mouseRelease( m_dt.data(), Qt::LeftButton, {}, p + m_delta, 20 );

			QTest::qWait( 500 );

			QVERIFY( m_dt->dateTime() == QDateTime( { 2021, 11, 25 }, { 14, 12 } ) );
		}

		{
			QPoint p( m_dtSections.at( 4 ), m_dt->height() / 2 );
			QTest::mousePress( m_dt.data(), Qt::LeftButton, {}, p, 20 );
			QMouseEvent me( QEvent::MouseMove, p + m_delta,
				m_dt->mapToGlobal( p + m_delta ),
				Qt::LeftButton, Qt::LeftButton, {} );
			QApplication::sendEvent( m_dt.data(), &me );
			QTest::qWait( 500 );
			QTest::mouseRelease( m_dt.data(), Qt::LeftButton, {}, p + m_delta, 20 );

			QTest::qWait( 500 );

			QVERIFY( m_dt->dateTime() == QDateTime( { 2021, 11, 25 }, { 14, 13 } ) );
		}

		{
			QPoint p( m_dtSections.at( 5 ), m_dt->height() / 2 );
			QTest::mousePress( m_dt.data(), Qt::LeftButton, {}, p, 20 );
			QMouseEvent me( QEvent::MouseMove, p - m_delta,
				m_dt->mapToGlobal( p - m_delta ),
				Qt::LeftButton, Qt::LeftButton, {} );
			QApplication::sendEvent( m_dt.data(), &me );
			QTest::qWait( 500 );
			QTest::mouseRelease( m_dt.data(), Qt::LeftButton, {}, p - m_delta, 20 );

			QTest::qWait( 500 );

			QVERIFY( m_dt->dateTime() == QDateTime( { 2021, 11, 25 }, { 2, 13 } ) );
		}

		m_dt->hide();
	}